

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_get_sibling(lys_node *siblings,char *mod_name,int mod_name_len,char *name,int nam_len,
                   LYS_NODE type,lys_node **ret)

{
  lys_node **pplVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  lys_node *plVar5;
  lys_module *module;
  lys_node *plVar6;
  lys_module *plVar7;
  
  if (((siblings == (lys_node *)0x0) || (mod_name == (char *)0x0)) || (name == (char *)0x0)) {
    __assert_fail("siblings && mod_name && name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x94,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  if ((type & (LYS_USES|LYS_GROUPING)) != LYS_UNKNOWN) {
    __assert_fail("!(type & (LYS_USES | LYS_GROUPING))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x95,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  if (mod_name_len == 0) {
    sVar4 = strlen(mod_name);
    mod_name_len = (int)sVar4;
  }
  if (nam_len == 0) {
    sVar4 = strlen(name);
    nam_len = (int)sVar4;
  }
  while( true ) {
    if (siblings == (lys_node *)0x0) {
      return 1;
    }
    if (siblings->nodetype != LYS_USES) break;
    siblings = siblings->child;
  }
  plVar6 = siblings;
  if (siblings->nodetype == LYS_GROUPING) {
    while (plVar6->nodetype == LYS_GROUPING) {
      pplVar1 = &plVar6->prev;
      plVar6 = *pplVar1;
      if (*pplVar1 == siblings) {
        return 1;
      }
    }
  }
  module = (lys_module *)0x0;
  plVar5 = plVar6;
  do {
    plVar5 = lys_parent(plVar5);
    if (plVar5 == (lys_node *)0x0) goto LAB_001561be;
  } while (plVar5->nodetype == LYS_USES);
  goto LAB_001561dc;
  while (plVar5->nodetype == LYS_USES) {
LAB_001561be:
    plVar5 = plVar6;
    plVar6 = lys_parent(plVar5);
    if (plVar6 == (lys_node *)0x0) break;
  }
  module = lys_node_module(plVar5);
  plVar5 = (lys_node *)0x0;
LAB_001561dc:
  plVar6 = (lys_node *)0x0;
  do {
    do {
      plVar6 = lys_getnext(plVar6,plVar5,module,0xb);
      if (plVar6 == (lys_node *)0x0) {
        return 1;
      }
    } while ((type != LYS_UNKNOWN) && ((plVar6->nodetype & type) == LYS_UNKNOWN));
    plVar7 = plVar6->module;
    if ((plVar7->field_0x40 & 1) != 0) {
      plVar7 = (lys_module *)plVar7->data;
    }
    pcVar2 = plVar7->name;
  } while (((pcVar2 != mod_name) &&
           ((iVar3 = strncmp(pcVar2,mod_name,(long)mod_name_len), iVar3 != 0 ||
            (pcVar2[mod_name_len] != '\0')))) ||
          ((pcVar2 = plVar6->name, pcVar2 != name &&
           ((iVar3 = strncmp(pcVar2,name,(long)nam_len), iVar3 != 0 || (pcVar2[nam_len] != '\0')))))
          );
  if (ret != (lys_node **)0x0) {
    *ret = plVar6;
  }
  return 0;
}

Assistant:

int
lys_get_sibling(const struct lys_node *siblings, const char *mod_name, int mod_name_len, const char *name,
                int nam_len, LYS_NODE type, const struct lys_node **ret)
{
    const struct lys_node *node, *parent = NULL;
    const struct lys_module *mod = NULL;
    const char *node_mod_name;

    assert(siblings && mod_name && name);
    assert(!(type & (LYS_USES | LYS_GROUPING)));

    /* fill the lengths in case the caller is so indifferent */
    if (!mod_name_len) {
        mod_name_len = strlen(mod_name);
    }
    if (!nam_len) {
        nam_len = strlen(name);
    }

    while (siblings && (siblings->nodetype == LYS_USES)) {
        siblings = siblings->child;
    }
    if (!siblings) {
        /* unresolved uses */
        return EXIT_FAILURE;
    }

    if (siblings->nodetype == LYS_GROUPING) {
        for (node = siblings; (node->nodetype == LYS_GROUPING) && (node->prev != siblings); node = node->prev);
        if (node->nodetype == LYS_GROUPING) {
            /* we went through all the siblings, only groupings there - no valid sibling */
            return EXIT_FAILURE;
        }
        /* update siblings to be valid */
        siblings = node;
    }

    /* set parent correctly */
    parent = lys_parent(siblings);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (!parent) {
        /* handle situation when there is a top-level uses referencing a foreign grouping */
        for (node = siblings; lys_parent(node) && (node->nodetype == LYS_USES); node = lys_parent(node));
        mod = lys_node_module(node);
    }

    /* try to find the node */
    node = NULL;
    while ((node = lys_getnext(node, parent, mod, LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
        if (!type || (node->nodetype & type)) {
            /* module name comparison */
            node_mod_name = lys_node_module(node)->name;
            if (!ly_strequal(node_mod_name, mod_name, 1) && (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len])) {
                continue;
            }

            /* direct name check */
            if (ly_strequal(node->name, name, 1) || (!strncmp(node->name, name, nam_len) && !node->name[nam_len])) {
                if (ret) {
                    *ret = node;
                }
                return EXIT_SUCCESS;
            }
        }
    }

    return EXIT_FAILURE;
}